

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void deqp::gls::BuiltinPrecisionTests::addBuiltinPrecisionTests
               (TestContext *testCtx,RenderContext *renderCtx,CaseFactories *cases,
               vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *shaderTypes,
               TestCaseGroup *dstGroup)

{
  int iVar1;
  TestNode *node;
  ulong uVar2;
  long lVar3;
  _Vector_base<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*>_>
  local_108;
  PrecisionTestContext ctx;
  FloatFormat lowp;
  FloatFormat mediump;
  FloatFormat highp;
  
  iVar1 = tcu::CommandLine::getTestIterationCount(testCtx->m_cmdLine);
  ctx.numRandoms = 0x4000;
  if (0 < iVar1) {
    ctx.numRandoms = iVar1;
  }
  tcu::FloatFormat::FloatFormat(&highp,-0x7e,0x7f,0x17,true,MAYBE,YES,MAYBE);
  uVar2 = 0;
  tcu::FloatFormat::FloatFormat(&mediump,-0xd,0xd,9,false,MAYBE,MAYBE,MAYBE);
  tcu::FloatFormat::FloatFormat(&lowp,0,0,7,false,YES,MAYBE,MAYBE);
  ctx.testCtx = testCtx;
  ctx.renderCtx = renderCtx;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::vector
            (&ctx.shaderTypes,shaderTypes);
  ctx.formats[2] = &highp;
  ctx.formats[1] = &mediump;
  ctx.formats[0] = &lowp;
  while( true ) {
    (*cases->_vptr_CaseFactories[2])(&local_108,cases);
    lVar3 = (long)local_108._M_impl.super__Vector_impl_data._M_finish -
            (long)local_108._M_impl.super__Vector_impl_data._M_start;
    std::
    _Vector_base<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*>_>
    ::~_Vector_base(&local_108);
    if ((ulong)(lVar3 >> 3) <= uVar2) break;
    (*cases->_vptr_CaseFactories[2])(&local_108,cases);
    node = &createFuncGroup(&ctx,local_108._M_impl.super__Vector_impl_data._M_start[uVar2])->
            super_TestNode;
    tcu::TestNode::addChild(&dstGroup->super_TestNode,node);
    std::
    _Vector_base<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*>_>
    ::~_Vector_base(&local_108);
    uVar2 = uVar2 + 1;
  }
  std::_Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>::~_Vector_base
            (&ctx.shaderTypes.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>)
  ;
  return;
}

Assistant:

void addBuiltinPrecisionTests (TestContext&					testCtx,
							   RenderContext&				renderCtx,
							   const CaseFactories&			cases,
							   const vector<ShaderType>&	shaderTypes,
							   TestCaseGroup&				dstGroup)
{
	const int						userRandoms	= testCtx.getCommandLine().getTestIterationCount();
	const int						defRandoms	= 16384;
	const int						numRandoms	= userRandoms > 0 ? userRandoms : defRandoms;
	const FloatFormat				highp		(-126, 127, 23, true,
												 tcu::MAYBE,	// subnormals
												 tcu::YES,		// infinities
												 tcu::MAYBE);	// NaN
	// \todo [2014-04-01 lauri] Check these once Khronos bug 11840 is resolved.
	const FloatFormat				mediump		(-13, 13, 9, false);
	// A fixed-point format is just a floating point format with a fixed
	// exponent and support for subnormals.
	const FloatFormat				lowp		(0, 0, 7, false, tcu::YES);
	const PrecisionTestContext		ctx			(testCtx, renderCtx, highp, mediump, lowp,
												 shaderTypes, numRandoms);

	for (size_t ndx = 0; ndx < cases.getFactories().size(); ++ndx)
		dstGroup.addChild(createFuncGroup(ctx, *cases.getFactories()[ndx]));
}